

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::getTextureImageDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,int textureTarget,int mipLevel
          ,int imageIndex)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  ostringstream result;
  undefined1 local_1a0 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"level ",6);
  std::ostream::operator<<(local_1a0,textureTarget);
  lVar1 = 0xb;
  iVar3 = (int)this;
  if (iVar3 == 0x806f) {
    pcVar2 = " and Slice ";
  }
  else if (iVar3 == 0x8513) {
    lVar1 = 10;
    pcVar2 = " and Face ";
  }
  else {
    if (iVar3 != 0x8c1a) goto LAB_01698d63;
    pcVar2 = " and Layer ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar2,lVar1);
  std::ostream::operator<<(local_1a0,mipLevel);
LAB_01698d63:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

string getTextureImageDescription (int textureTarget, int mipLevel, int imageIndex)
{
	std::ostringstream result;
	result << "level ";
	result << mipLevel;

	switch (textureTarget)
	{
		case GL_TEXTURE_2D:			break;
		case GL_TEXTURE_3D:			result << " and Slice " << imageIndex; break;
		case GL_TEXTURE_CUBE_MAP:	result << " and Face " << imageIndex; break;
		case GL_TEXTURE_2D_ARRAY:	result << " and Layer " << imageIndex; break;
		default:
			DE_FATAL("Unsupported texture target");
			break;
	}
	return result.str();
}